

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowSize(ImGuiWindow *window,ImVec2 *size,ImGuiCond cond)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if ((cond != 0) && (((char)(*(uint *)&window->field_0xf0 >> 8) & cond) == 0)) {
    return;
  }
  *(uint *)&window->field_0xf0 = *(uint *)&window->field_0xf0 & 0xfffff1ff;
  if (((window->Flags & 0x1000000) == 0) || (window->Appearing != false)) {
    window->AutoFitFramesX = (size->x <= 0.0) * '\x02';
  }
  else {
    if ((window->ChildFlags & 0x40) != 0) {
      window->AutoFitFramesX = (size->x <= 0.0) * '\x02';
    }
    if ((window->ChildFlags & 0x40) == 0) goto LAB_00162cae;
  }
  window->AutoFitFramesY = (size->y <= 0.0) * '\x02';
LAB_00162cae:
  fVar1 = (window->SizeFull).x;
  if (size->x <= 0.0) {
    window->AutoFitOnlyGrows = false;
    fVar3 = fVar1;
  }
  else {
    fVar3 = (float)(int)size->x;
    (window->SizeFull).x = fVar3;
  }
  fVar2 = (window->SizeFull).y;
  if (size->y <= 0.0) {
    window->AutoFitOnlyGrows = false;
    fVar4 = fVar2;
  }
  else {
    fVar4 = (float)(int)size->y;
    (window->SizeFull).y = fVar4;
  }
  if ((((fVar1 == fVar3) && (!NAN(fVar1) && !NAN(fVar3))) && (fVar2 == fVar4)) &&
     (!NAN(fVar2) && !NAN(fVar4))) {
    return;
  }
  MarkIniSettingsDirty(window);
  return;
}

Assistant:

void ImGui::SetWindowSize(ImGuiWindow* window, const ImVec2& size, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowSizeAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowSizeAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);

    // Enable auto-fit (not done in BeginChild() path unless appearing or combined with ImGuiChildFlags_AlwaysAutoResize)
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesX = (size.x <= 0.0f) ? 2 : 0;
    if ((window->Flags & ImGuiWindowFlags_ChildWindow) == 0 || window->Appearing || (window->ChildFlags & ImGuiChildFlags_AlwaysAutoResize) != 0)
        window->AutoFitFramesY = (size.y <= 0.0f) ? 2 : 0;

    // Set
    ImVec2 old_size = window->SizeFull;
    if (size.x <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.x = IM_TRUNC(size.x);
    if (size.y <= 0.0f)
        window->AutoFitOnlyGrows = false;
    else
        window->SizeFull.y = IM_TRUNC(size.y);
    if (old_size.x != window->SizeFull.x || old_size.y != window->SizeFull.y)
        MarkIniSettingsDirty(window);
}